

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void tlbi_aa64_vae3_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  target_ulong addr;
  CPUARMState_conflict *__mptr;
  
  addr = sextract64(value << 0xc,0,0x38);
  tlb_flush_page_by_mmuidx_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),addr,0x400);
  return;
}

Assistant:

static void tlbi_aa64_vae3_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                 uint64_t value)
{
    /* Invalidate by VA, EL3
     * Currently handles both VAE3 and VALE3, since we don't support
     * flush-last-level-only.
     */
    ARMCPU *cpu = env_archcpu(env);
    CPUState *cs = CPU(cpu);
    uint64_t pageaddr = sextract64(value << 12, 0, 56);

    tlb_flush_page_by_mmuidx(cs, pageaddr, ARMMMUIdxBit_SE3);
}